

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_set.hpp
# Opt level: O3

pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
 __thiscall
itlib::
flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
::insert<Rml::Element*&>
          (flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
           *this,Element **val)

{
  Element **ppEVar1;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  __position;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  pair<__gnu_cxx::__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>,_bool>
  pVar5;
  
  __position._M_current = *(Element ***)this;
  uVar3 = (long)*(Element ***)(this + 8) - (long)__position._M_current >> 3;
  if (0 < (long)uVar3) {
    do {
      uVar4 = uVar3 >> 1;
      uVar3 = ~uVar4 + uVar3;
      ppEVar1 = __position._M_current + uVar4 + 1;
      if (*val <= __position._M_current[uVar4]) {
        uVar3 = uVar4;
        ppEVar1 = __position._M_current;
      }
      __position._M_current = ppEVar1;
    } while (0 < (long)uVar3);
  }
  if ((__position._M_current == *(Element ***)(this + 8)) || (*val < *__position._M_current)) {
    __position._M_current =
         (Element **)
         std::vector<Rml::Element*,std::allocator<Rml::Element*>>::_M_emplace_aux<Rml::Element*&>
                   ((vector<Rml::Element*,std::allocator<Rml::Element*>> *)this,
                    __position._M_current,val);
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar2 = 0;
  }
  pVar5._8_8_ = uVar2;
  pVar5.first._M_current = __position._M_current;
  return pVar5;
}

Assistant:

std::pair<iterator, bool> insert(P&& val)
    {
        auto i = lower_bound(val);
        if (i != end() && !cmp()(val, *i))
        {
            return { i, false };
        }

        return{ m_container.emplace(i, std::forward<P>(val)), true };
    }